

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.h
# Opt level: O0

bool operator==(QBitArray *lhs,QBitArray *rhs)

{
  long lVar1;
  bool bVar2;
  QBitArray *in_RSI;
  long in_FS_OFFSET;
  anon_class_1_0_00000001 f;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = comparesEqual(in_RSI,(QBitArray *)
                               CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

class QT6_ONLY(Q_CORE_EXPORT) QBitRef
{
private:
    QBitArray &a;
    qsizetype i;
    inline QBitRef(QBitArray &array, qsizetype idx) : a(array), i(idx) { }
    friend class QBitArray;

public:
    inline operator bool() const { return a.testBit(i); }